

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O3

int AF_A_SorcBallOrbit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  PClass *pPVar3;
  double dVar4;
  VM_UBYTE VVar5;
  undefined8 *puVar6;
  AActor *this;
  AActor *pAVar7;
  PClass *pPVar8;
  int iVar9;
  undefined4 extraout_var;
  PClass *pPVar10;
  FState *pFVar11;
  PClass *pPVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int **pp_Var13;
  uint uVar14;
  AActor *this_00;
  VMValue *pVVar15;
  FName *label;
  char *__assertion;
  bool bVar16;
  bool bVar17;
  DVector3 pos;
  FSoundID local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  DAngle local_48;
  DVector3 local_40;
  undefined4 extraout_var_00;
  
  pPVar3 = ASorcBall::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e031e;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_005e030e:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_005e031e:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0xfc,"int AF_A_SorcBallOrbit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this_00 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag != 1) {
    if (this_00 == (AActor *)0x0) goto LAB_005dfd85;
    goto LAB_005e030e;
  }
  if (this_00 == (AActor *)0x0) {
LAB_005dfd85:
    this_00 = (AActor *)0x0;
    pVVar15 = param;
    uVar14 = numparam;
  }
  else {
    pPVar10 = (this_00->super_DThinker).super_DObject.Class;
    if (pPVar10 == (PClass *)0x0) {
      iVar9 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
      pPVar10 = (PClass *)CONCAT44(extraout_var,iVar9);
      (this_00->super_DThinker).super_DObject.Class = pPVar10;
    }
    bVar16 = pPVar10 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar16;
    bVar17 = pPVar10 == pPVar3;
    if (!bVar17 && !bVar16) {
      do {
        pPVar10 = pPVar10->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar10 != (PClass *)0x0);
        if (pPVar10 == pPVar3) break;
      } while (pPVar10 != (PClass *)0x0);
    }
    pVVar15 = (VMValue *)(ulong)(bVar17 || bVar16);
    uVar14 = (uint)bVar16;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(ASorcBall))";
      goto LAB_005e031e;
    }
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar5 = param[1].field_0.field_3.Type;
    if (VVar5 != 0xff) {
      if (VVar5 != '\x03') goto LAB_005e030e;
      puVar6 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar6 != (undefined8 *)0x0) {
          pPVar10 = (PClass *)puVar6[1];
          if (pPVar10 == (PClass *)0x0) {
            pPVar10 = (PClass *)(**(code **)*puVar6)(puVar6,pVVar15,uVar14,ret);
            puVar6[1] = pPVar10;
          }
          bVar16 = pPVar10 != (PClass *)0x0;
          if (pPVar10 != pPVar3 && bVar16) {
            do {
              pPVar10 = pPVar10->ParentClass;
              bVar16 = pPVar10 != (PClass *)0x0;
              if (pPVar10 == pPVar3) break;
            } while (pPVar10 != (PClass *)0x0);
          }
          if (!bVar16) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005e031e;
          }
        }
      }
      else if (puVar6 != (undefined8 *)0x0) goto LAB_005e030e;
    }
    if (((2 < numparam) && (VVar5 = param[2].field_0.field_3.Type, VVar5 != 0xff)) &&
       ((VVar5 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e031e;
    }
  }
  this = (this_00->target).field_0.p;
  if (this == (AActor *)0x0) {
LAB_005dff09:
    label = &local_4c;
LAB_005dff0e:
    label->Index = 0x83;
    pFVar11 = AActor::FindState(this_00,label);
    AActor::SetState(this_00,pFVar11,false);
    return 0;
  }
  if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this_00->target).field_0.p = (AActor *)0x0;
    goto LAB_005dff09;
  }
  if (this->health < 1) {
    label = &local_50;
    goto LAB_005dff0e;
  }
  dVar1 = this->radius;
  dVar2 = this_00->radius;
  iVar9 = this->args[3];
  pPVar3 = this_00[1].super_DThinker.super_DObject.Class;
  pPVar10 = (PClass *)
            ((double)this[1].super_DThinker.super_DObject.Class +
            (double)this_00[1].super_DThinker.super_DObject._vptr_DObject);
  (this_00->Angles).Yaw.Degrees = (double)pPVar10;
  switch(iVar9) {
  case 0:
    if (this->args[2] < this->args[4]) {
      this->args[4] = this->args[4] + -1;
    }
    else {
      this->args[3] = 5;
    }
    (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x26])(this_00);
    break;
  case 1:
    A_AccelBalls(this_00);
    pp_Var13 = (this_00->super_DThinker).super_DObject._vptr_DObject;
    goto LAB_005e0164;
  case 2:
    pPVar8 = (PClass *)this[1].super_DThinker.super_DObject._vptr_DObject;
    pPVar12 = (this_00->super_DThinker).super_DObject.Class;
    if (pPVar12 == (PClass *)0x0) {
      iVar9 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
      pPVar12 = (PClass *)CONCAT44(extraout_var_00,iVar9);
      (this_00->super_DThinker).super_DObject.Class = pPVar12;
    }
    if (((pPVar8 != pPVar12) || (this->args[1] < 6)) ||
       (dVar4 = (this->Angles).Yaw.Degrees,
       42.1875 <=
       ABS((double)SUB84(((double)pPVar10 - dVar4) * 11930464.711111112 + 6755399441055744.0,0) *
           8.381903171539307e-08))) {
      (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x26])(this_00);
    }
    else {
      pAVar7 = (this_00->target).field_0.p;
      pAVar7->args[3] = 3;
      pAVar7->args[4] = 0;
      this[1].super_DThinker.super_DObject.Class =
           (PClass *)(dVar4 - (double)this_00[1].super_DThinker.super_DObject._vptr_DObject);
    }
    break;
  case 3:
    pPVar8 = (PClass *)this[1].super_DThinker.super_DObject._vptr_DObject;
    pPVar12 = (this_00->super_DThinker).super_DObject.Class;
    if (pPVar12 == (PClass *)0x0) {
      iVar9 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
      pPVar12 = (PClass *)CONCAT44(extraout_var_02,iVar9);
      (this_00->super_DThinker).super_DObject.Class = pPVar12;
    }
    if (pPVar8 == pPVar12) {
      if (0 < this->health) {
        local_54.Index = FName::NameManager::FindName(&FName::NameData,"Attack1",false);
        pFVar11 = AActor::FindState(this,&local_54);
        AActor::SetState(this,pFVar11,false);
      }
      (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x25])(this_00);
    }
    break;
  case 5:
    pp_Var13 = (this_00->super_DThinker).super_DObject._vptr_DObject;
LAB_005e0164:
    (*pp_Var13[0x26])(this_00);
    break;
  case 6:
    pPVar8 = (PClass *)this[1].super_DThinker.super_DObject._vptr_DObject;
    pPVar12 = (this_00->super_DThinker).super_DObject.Class;
    if (pPVar12 == (PClass *)0x0) {
      iVar9 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
      pPVar12 = (PClass *)CONCAT44(extraout_var_01,iVar9);
      (this_00->super_DThinker).super_DObject.Class = pPVar12;
    }
    if (pPVar8 == pPVar12) {
      iVar9 = this_00->special2;
      this_00->special2 = iVar9 + -1;
      if (iVar9 < 1) {
        this->args[3] = 4;
        if (0 < this->health) {
          local_58.Index = FName::NameManager::FindName(&FName::NameData,"Attack2",false);
          pFVar11 = AActor::FindState(this,&local_58);
          AActor::SetState(this,pFVar11,false);
        }
      }
      else {
        A_SorcOffense2(this_00);
      }
    }
  }
  if ((SUB84((double)pPVar10 * 11930464.711111112 + 6755399441055744.0,0) <
       SUB84((double)pPVar3 * 11930464.711111112 + 6755399441055744.0,0)) && (this->args[4] == 0x19)
     ) {
    this->args[1] = this->args[1] + 1;
    local_5c.ID = S_FindSound("SorcererBallWoosh");
    S_Sound(this_00,4,&local_5c,1.0,1.0);
  }
  this_00[1].super_DThinker.super_DObject.Class = pPVar10;
  local_48.Degrees = (double)pPVar10;
  AActor::Vec3Angle(&local_40,this,dVar1 - (dVar2 + dVar2),&local_48,this->Height - this->Floorclip,
                    false);
  (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x22])
            (local_40.X,local_40.Y,local_40.Z,this_00,1);
  dVar1 = this->ceilingz;
  this_00->floorz = this->floorz;
  this_00->ceilingz = dVar1;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcBallOrbit)
{
	PARAM_ACTION_PROLOGUE_TYPE(ASorcBall);

	// [RH] If no parent, then die instead of crashing
	if (self->target == NULL)
	{
		self->SetState (self->FindState(NAME_Pain));
		return 0;
	}

	int mode = self->target->args[3];
	AHeresiarch *parent = barrier_cast<AHeresiarch *>(self->target);
	double dist = parent->radius - (self->radius*2);

#if 0
	// This cannot happen anymore because this is defined locally in SorcBall
	if (!self->IsKindOf (RUNTIME_CLASS(ASorcBall)))
	{
		I_Error ("Corrupted sorcerer:\nTried to use a %s", self->GetClass()->TypeName.GetChars());
	}
#endif

	if (self->target->health <= 0)
	{
		self->SetState (self->FindState(NAME_Pain));
		return 0;
	}

	DAngle prevangle = self->OldAngle;
	DAngle baseangle = parent->BallAngle;
	DAngle angle = baseangle + self->AngleOffset;

	self->Angles.Yaw = angle;

	switch (mode)
	{
	case SORC_NORMAL:			// Balls rotating normally
		self->SorcUpdateBallAngle ();
		break;

	case SORC_DECELERATE:		// Balls decelerating
		A_DecelBalls(self);
		self->SorcUpdateBallAngle ();
		break;

	case SORC_ACCELERATE:		// Balls accelerating
		A_AccelBalls(self);
		self->SorcUpdateBallAngle ();
		break;

	case SORC_STOPPING:			// Balls stopping
		if ((parent->StopBall == self->GetClass()) &&
			 (parent->args[1] > SORCBALL_SPEED_ROTATIONS) &&
			 absangle(angle, parent->Angles.Yaw) < 42.1875)
		{
			// Can stop now
			self->target->args[3] = SORC_FIRESPELL;
			self->target->args[4] = 0;
			// Set angle so self angle == sorcerer angle
			parent->BallAngle = parent->Angles.Yaw - self->AngleOffset;
		}
		else
		{
			self->SorcUpdateBallAngle ();
		}
		break;

	case SORC_FIRESPELL:			// Casting spell
		if (parent->StopBall == self->GetClass())
		{
			// Put sorcerer into special throw spell anim
			if (parent->health > 0)
				parent->SetState (parent->FindState("Attack1"));

			self->DoFireSpell ();
		}
		break;

	case SORC_FIRING_SPELL:
		if (parent->StopBall == self->GetClass())
		{
			if (self->special2-- <= 0)
			{
				// Done rapid firing 
				parent->args[3] = SORC_STOPPED;
				// Back to orbit balls
				if (parent->health > 0)
					parent->SetState (parent->FindState("Attack2"));
			}
			else
			{
				// Do rapid fire spell
				A_SorcOffense2(self);
			}
		}
		break;

	case SORC_STOPPED:			// Balls stopped
	default:
		break;
	}

	if ( angle.BAMs() < prevangle.BAMs() && (parent->args[4]==SORCBALL_TERMINAL_SPEED))
	{
		parent->args[1]++;			// Bump rotation counter
		// Completed full rotation - make woosh sound
		S_Sound (self, CHAN_BODY, "SorcererBallWoosh", 1, ATTN_NORM);
	}
	self->OldAngle = angle;		// Set previous angle

	DVector3 pos = parent->Vec3Angle(dist, angle, -parent->Floorclip + parent->Height);
	self->SetOrigin (pos, true);
	self->floorz = parent->floorz;
	self->ceilingz = parent->ceilingz;
	return 0;
}